

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_constraints.c
# Opt level: O0

void PrintFinalStats(void *cvode_mem)

{
  undefined4 uVar1;
  undefined8 in_RDI;
  int retval;
  long nge;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  uVar1 = CVodeGetNumSteps(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumRhsEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumLinSolvSetups(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumErrTestFails(local_8,&local_50);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumNonlinSolvIters(local_8,&local_38);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumNonlinSolvConvFails(local_8,&local_40);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumStepSolveFails(local_8,&local_48);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumJacEvals(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumLinRhsEvals(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  uVar1 = CVodeGetNumGEvals(local_8,&stack0xffffffffffffffa8);
  check_retval(in_stack_ffffffffffffffa8,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",local_10,local_18,
         local_20,local_30,local_28);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld  nge = %ld\n\n",local_38,local_40,
         local_50,local_48,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int nst, nfe, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nge;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &nnf);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumStepSolveFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumStepSolveFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  retval = CVodeGetNumGEvals(cvode_mem, &nge);
  check_retval(&retval, "CVodeGetNumGEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld  nge = %ld\n\n",
         nni, nnf, netf, ncfn, nge);
}